

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O2

void __thiscall llvm::yaml::Output::endMapping(Output *this)

{
  size_t sVar1;
  reference pIVar2;
  StringRef s;
  
  pIVar2 = SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>::back
                     ((SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void> *)
                      &this->StateStack);
  if (*pIVar2 == inMapFirstKey) {
    sVar1 = (this->PaddingBeforeContainer).Length;
    (this->Padding).Data = (this->PaddingBeforeContainer).Data;
    (this->Padding).Length = sVar1;
    newLineCheck(this);
    s.Length = 2;
    s.Data = "{}";
    output(this,s);
    (this->Padding).Data = "\n";
    (this->Padding).Length = 1;
  }
  SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>::pop_back
            ((SmallVectorTemplateBase<llvm::yaml::Output::InState,_true> *)&this->StateStack);
  return;
}

Assistant:

void Output::endMapping() {
  // If we did not map anything, we should explicitly emit an empty map
  if (StateStack.back() == inMapFirstKey) {
    Padding = PaddingBeforeContainer;
    newLineCheck();
    output("{}");
    Padding = "\n";
  }
  StateStack.pop_back();
}